

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O2

void xmlRngPErr(xmlRelaxNGParserCtxtPtr ctxt,xmlNodePtr node,int error,char *msg,xmlChar *str1,
               xmlChar *str2)

{
  int iVar1;
  xmlGenericErrorFunc *pp_Var2;
  void **ppvVar3;
  void *data;
  xmlGenericErrorFunc channel;
  xmlStructuredErrorFunc schannel;
  
  if (ctxt == (xmlRelaxNGParserCtxtPtr)0x0) {
    channel = (xmlGenericErrorFunc)0x0;
    data = (void *)0x0;
    schannel = (xmlStructuredErrorFunc)0x0;
  }
  else {
    schannel = ctxt->serror;
    if (schannel == (xmlStructuredErrorFunc)0x0) {
      channel = ctxt->error;
    }
    else {
      channel = (xmlGenericErrorFunc)0x0;
    }
    data = ctxt->userData;
    ctxt->nbErrors = ctxt->nbErrors + 1;
  }
  if (channel == (xmlGenericErrorFunc)0x0 && schannel == (xmlStructuredErrorFunc)0x0) {
    pp_Var2 = __xmlGenericError();
    channel = *pp_Var2;
    ppvVar3 = __xmlGenericErrorContext();
    data = *ppvVar3;
  }
  iVar1 = xmlRaiseError(schannel,channel,data,(void *)0x0,node,0x12,error,XML_ERR_ERROR,(char *)0x0,
                        0,(char *)str1,(char *)str2,(char *)0x0,0,0,msg,str1,str2);
  if (-1 < iVar1) {
    return;
  }
  xmlRngPErrMemory(ctxt);
  return;
}

Assistant:

static void LIBXML_ATTR_FORMAT(4,0)
xmlRngPErr(xmlRelaxNGParserCtxtPtr ctxt, xmlNodePtr node, int error,
           const char *msg, const xmlChar * str1, const xmlChar * str2)
{
    xmlStructuredErrorFunc schannel = NULL;
    xmlGenericErrorFunc channel = NULL;
    void *data = NULL;
    int res;

    if (ctxt != NULL) {
        if (ctxt->serror != NULL)
	    schannel = ctxt->serror;
	else
	    channel = ctxt->error;
        data = ctxt->userData;
        ctxt->nbErrors++;
    }